

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.h
# Opt level: O2

void cvarfunc_fluid_chorus_voices(FIntCVar *self)

{
  if (self->Value < 0) {
    FIntCVar::operator=(self,0);
    return;
  }
  if (99 < (uint)self->Value) {
    FIntCVar::operator=(self,99);
    return;
  }
  if (currSong != (MusInfo *)0x0) {
    (*currSong->_vptr_MusInfo[0x11])(currSong,"z.chorus-changed",0);
    return;
  }
  return;
}

Assistant:

inline operator int () const { return Value; }